

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

TryEmplaceResult * __thiscall
QHash<std::pair<int,int>,std::function<bool(void*,void*)>>::
tryEmplace_impl<std::pair<int,int>const&,std::function<bool(void*,void*)>const&>
          (TryEmplaceResult *__return_storage_ptr__,
          QHash<std::pair<int,int>,std::function<bool(void*,void*)>> *this,pair<int,_int> *key,
          function<bool_(void_*,_void_*)> *args)

{
  uchar uVar1;
  Span *pSVar2;
  Bucket BVar3;
  Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
  *pDVar4;
  QHashMultiReturnType<int,_int> hash;
  Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_> *pNVar6;
  uint uVar8;
  long in_FS_OFFSET;
  Bucket BVar9;
  undefined8 local_40;
  long local_38;
  Span *pSVar5;
  ulong uVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
             **)this;
  if (pDVar4 == (Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                 *)0x0) {
    pDVar4 = QHashPrivate::
             Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>::
             detached((Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                       *)0x0);
    *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_> **
     )this = pDVar4;
  }
  local_40 = 0;
  hash = qHashMulti<int,int>(pDVar4->seed,&key->first,&key->second);
  BVar9 = QHashPrivate::
          Data<QHashPrivate::Node<std::pair<int,int>,std::function<bool(void*,void*)>>>::
          findBucketWithHash<std::pair<int,int>>
                    (*(Data<QHashPrivate::Node<std::pair<int,int>,std::function<bool(void*,void*)>>>
                       **)this,key,hash);
  uVar7 = BVar9.index;
  pSVar5 = BVar9.span;
  uVar1 = pSVar5->offsets[uVar7];
  pDVar4 = *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
             **)this;
  if ((pDVar4 == (Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                  *)0x0) || (1 < (uint)(pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i))
  {
    QHash<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>::operator=
              ((QHash<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_> *)&local_40,
               (QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *)this);
    if (uVar1 == 0xff) {
LAB_002a7400:
      pDVar4 = *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                 **)this;
      if (pDVar4->numBuckets >> 1 <= pDVar4->size) {
        pDVar4 = QHashPrivate::
                 Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
                 ::detached(pDVar4,pDVar4->size + 1);
        *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
          **)this = pDVar4;
        BVar9 = QHashPrivate::
                Data<QHashPrivate::Node<std::pair<int,int>,std::function<bool(void*,void*)>>>::
                findBucketWithHash<std::pair<int,int>>
                          ((Data<QHashPrivate::Node<std::pair<int,int>,std::function<bool(void*,void*)>>>
                            *)pDVar4,key,hash);
        goto LAB_002a747d;
      }
    }
    else {
      pDVar4 = *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                 **)this;
    }
    pSVar2 = pDVar4->spans;
    pDVar4 = QHashPrivate::
             Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>::
             detached(pDVar4);
    *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_> **
     )this = pDVar4;
    uVar8 = (uint)BVar9.index & 0x7f;
    BVar9.index._0_4_ = uVar8;
    BVar9.span = pDVar4->spans +
                 ((((ulong)((long)pSVar5 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar7) >> 7);
    BVar9.index._4_4_ = 0;
    BVar3.index._0_4_ = uVar8;
    BVar3.span = pDVar4->spans +
                 ((((ulong)((long)pSVar5 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar7) >> 7);
    BVar3.index._4_4_ = 0;
    if (uVar1 != 0xff) goto LAB_002a74a7;
  }
  else {
    BVar3 = BVar9;
    if (uVar1 != 0xff) goto LAB_002a74a7;
    if (pDVar4->numBuckets >> 1 <= pDVar4->size) {
      QHash<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>::operator=
                ((QHash<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_> *)&local_40,
                 (QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *)this);
      goto LAB_002a7400;
    }
  }
LAB_002a747d:
  pNVar6 = QHashPrivate::
           Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>::
           insert((Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
                   *)BVar9.span,BVar9.index);
  pNVar6->key = *key;
  std::function<bool_(void_*,_void_*)>::function(&pNVar6->value,args);
  pDVar4 = *(Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
             **)this;
  pDVar4->size = pDVar4->size + 1;
  BVar3 = BVar9;
LAB_002a74a7:
  pSVar5 = pDVar4->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar4;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar3.span - (long)pSVar5) >> 4) * 0x1c71c71c71c71c80 | BVar3.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>::~QHash
            ((QHash<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_> *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }